

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O2

void __thiscall
Encoder::CopyMaps<false>
          (Encoder *this,OffsetList **m_origInlineeFrameRecords,OffsetList **m_origInlineeFrameMap,
          OffsetList **m_origPragmaInstrToRecordOffset,OffsetList **m_origOffsetBuffer)

{
  List<InlineeFrameRecord_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  List<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_01;
  List<IR::PragmaInstr_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_02;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this_03;
  List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this_04;
  List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this_05;
  OffsetList *pOVar4;
  Type *ppIVar5;
  Type *item;
  Type *ppPVar6;
  long lVar7;
  int i_2;
  ulong uVar8;
  int i;
  int iVar9;
  
  this_00 = this->m_inlineeFrameRecords;
  this_01 = this->m_inlineeFrameMap;
  this_02 = this->m_pragmaInstrToRecordOffset;
  if (*m_origInlineeFrameRecords != (OffsetList *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                       ,0x601,"(*m_origInlineeFrameRecords == nullptr)",
                       "*m_origInlineeFrameRecords == nullptr");
    if (!bVar2) goto LAB_003f2e45;
    *puVar3 = 0;
  }
  if (*m_origInlineeFrameMap != (OffsetList *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                       ,0x602,"(*m_origInlineeFrameMap == nullptr)",
                       "*m_origInlineeFrameMap == nullptr");
    if (!bVar2) goto LAB_003f2e45;
    *puVar3 = 0;
  }
  if (*m_origPragmaInstrToRecordOffset != (OffsetList *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                       ,0x603,"(*m_origPragmaInstrToRecordOffset == nullptr)",
                       "*m_origPragmaInstrToRecordOffset == nullptr");
    if (!bVar2) goto LAB_003f2e45;
    *puVar3 = 0;
  }
  iVar9 = 0;
  this_03 = (List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)new<Memory::ArenaAllocator>(0x30,this->m_tempAlloc,0x35916e);
  (this_03->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).alloc =
       this->m_tempAlloc;
  (this_03->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).
  _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_01371bd8;
  (this_03->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).buffer =
       (Type)0x0;
  (this_03->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).count = 0;
  this_03->length = 0;
  this_03->increment = 4;
  *m_origInlineeFrameRecords = this_03;
  this_04 = (List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)new<Memory::ArenaAllocator>(0x30,this->m_tempAlloc,0x35916e);
  (this_04->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).alloc =
       this->m_tempAlloc;
  (this_04->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).
  _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_01371bd8;
  (this_04->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).buffer =
       (Type)0x0;
  (this_04->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).count = 0;
  this_04->length = 0;
  this_04->increment = 4;
  *m_origInlineeFrameMap = this_04;
  this_05 = (List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)new<Memory::ArenaAllocator>(0x30,this->m_tempAlloc,0x35916e);
  (this_05->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).alloc =
       this->m_tempAlloc;
  (this_05->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).
  _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_01371bd8;
  (this_05->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).buffer =
       (Type)0x0;
  (this_05->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).count = 0;
  this_05->length = 0;
  this_05->increment = 4;
  *m_origPragmaInstrToRecordOffset = this_05;
  if (*m_origOffsetBuffer != (OffsetList *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                       ,0x60a,"((*m_origOffsetBuffer) == nullptr)",
                       "(*m_origOffsetBuffer) == nullptr");
    if (!bVar2) {
LAB_003f2e45:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pOVar4 = (OffsetList *)new<Memory::ArenaAllocator>(0x30,this->m_tempAlloc,0x35916e);
  (pOVar4->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).alloc =
       this->m_tempAlloc;
  (pOVar4->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).
  _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_01371bd8;
  (pOVar4->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).buffer =
       (Type)0x0;
  (pOVar4->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).count = 0;
  pOVar4->length = 0;
  pOVar4->increment = 4;
  *m_origOffsetBuffer = pOVar4;
  for (; iVar9 < (this_00->
                 super_ReadOnlyList<InlineeFrameRecord_*,_Memory::ArenaAllocator,_DefaultComparer>).
                 count; iVar9 = iVar9 + 1) {
    ppIVar5 = JsUtil::
              List<InlineeFrameRecord_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item(this_00,iVar9);
    JsUtil::List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::Add(this_03,&(*ppIVar5)->inlineeStartOffset);
  }
  for (iVar9 = 0;
      iVar9 < (this_01->
              super_ReadOnlyList<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_DefaultComparer>
              ).count; iVar9 = iVar9 + 1) {
    item = JsUtil::
           List<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           ::Item(this_01,iVar9);
    JsUtil::List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::Add(this_04,&item->offset);
  }
  for (iVar9 = 0;
      iVar9 < (this_02->
              super_ReadOnlyList<IR::PragmaInstr_*,_Memory::ArenaAllocator,_DefaultComparer>).count;
      iVar9 = iVar9 + 1) {
    ppPVar6 = JsUtil::
              List<IR::PragmaInstr_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item(this_02,iVar9);
    JsUtil::List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::Add(this_05,&(*ppPVar6)->m_offsetInBuffer);
  }
  lVar7 = 0;
  for (uVar8 = 0; uVar8 < this->m_instrNumber; uVar8 = uVar8 + 1) {
    JsUtil::List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::Add(*m_origOffsetBuffer,(uint *)((long)this->m_offsetBuffer + lVar7));
    lVar7 = lVar7 + 4;
  }
  return;
}

Assistant:

void Encoder::CopyMaps(OffsetList **m_origInlineeFrameRecords
    , OffsetList **m_origInlineeFrameMap
    , OffsetList **m_origPragmaInstrToRecordOffset
    , OffsetList **m_origOffsetBuffer
    )
{
    InlineeFrameRecords *recList = m_inlineeFrameRecords;
    ArenaInlineeFrameMap *mapList = m_inlineeFrameMap;
    PragmaInstrList *pInstrList = m_pragmaInstrToRecordOffset;

    OffsetList *origRecList, *origMapList, *origPInstrList;
    if (!restore)
    {
        Assert(*m_origInlineeFrameRecords == nullptr);
        Assert(*m_origInlineeFrameMap == nullptr);
        Assert(*m_origPragmaInstrToRecordOffset == nullptr);

        *m_origInlineeFrameRecords = origRecList = Anew(m_tempAlloc, OffsetList, m_tempAlloc);
        *m_origInlineeFrameMap = origMapList = Anew(m_tempAlloc, OffsetList, m_tempAlloc);
        *m_origPragmaInstrToRecordOffset = origPInstrList = Anew(m_tempAlloc, OffsetList, m_tempAlloc);

#if DBG_DUMP
        Assert((*m_origOffsetBuffer) == nullptr);
        *m_origOffsetBuffer = Anew(m_tempAlloc, OffsetList, m_tempAlloc);
#endif
    }
    else
    {
        Assert((*m_origInlineeFrameRecords) && (*m_origInlineeFrameMap) && (*m_origPragmaInstrToRecordOffset));
        origRecList = *m_origInlineeFrameRecords;
        origMapList = *m_origInlineeFrameMap;
        origPInstrList = *m_origPragmaInstrToRecordOffset;
        Assert(origRecList->Count() == recList->Count());
        Assert(origMapList->Count() == mapList->Count());
        Assert(origPInstrList->Count() == pInstrList->Count());

#if DBG_DUMP
        Assert(m_origOffsetBuffer);
        Assert((uint32)(*m_origOffsetBuffer)->Count() == m_instrNumber);
#endif
    }

    for (int i = 0; i < recList->Count(); i++)
    {
        if (!restore)
        {
            origRecList->Add(recList->Item(i)->inlineeStartOffset);
        }
        else
        {
            recList->Item(i)->inlineeStartOffset = origRecList->Item(i);
        }
    }

    for (int i = 0; i < mapList->Count(); i++)
    {
        if (!restore)
        {
            origMapList->Add(mapList->Item(i).offset);
        }
        else
        {
            mapList->Item(i).offset = origMapList->Item(i);
        }
    }

    for (int i = 0; i < pInstrList->Count(); i++)
    {
        if (!restore)
        {
            origPInstrList->Add(pInstrList->Item(i)->m_offsetInBuffer);
        }
        else
        {
            pInstrList->Item(i)->m_offsetInBuffer = origPInstrList->Item(i);
        }
    }

    if (restore)
    {
        (*m_origInlineeFrameRecords)->Delete();
        (*m_origInlineeFrameMap)->Delete();
        (*m_origPragmaInstrToRecordOffset)->Delete();
        (*m_origInlineeFrameRecords) = nullptr;
        (*m_origInlineeFrameMap) = nullptr;
        (*m_origPragmaInstrToRecordOffset) = nullptr;
    }

#if DBG_DUMP
    for (uint i = 0; i < m_instrNumber; i++)
    {
        if (!restore)
        {
            (*m_origOffsetBuffer)->Add(m_offsetBuffer[i]);
        }
        else
        {
            m_offsetBuffer[i] = (*m_origOffsetBuffer)->Item(i);
        }
    }

    if (restore)
    {
        (*m_origOffsetBuffer)->Delete();
        (*m_origOffsetBuffer) = nullptr;
    }
#endif
}